

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O1

string * __thiscall
Catch::ReporterFactory<Catch::TeamCityReporter>::getDescription_abi_cxx11_
          (string *__return_storage_ptr__,ReporterFactory<Catch::TeamCityReporter> *this)

{
  pointer pcVar1;
  size_type __dnew;
  size_type local_18;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  local_18 = 0x31;
  pcVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_create(__return_storage_ptr__,&local_18,0);
  (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
  (__return_storage_ptr__->field_2)._M_allocated_capacity = local_18;
  builtin_strncpy(pcVar1,"Reports test results as TeamCity service messages",0x31);
  __return_storage_ptr__->_M_string_length = local_18;
  pcVar1[local_18] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string getDescription() const override {
            return T::getDescription();
        }